

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall
QStandardItemModelPrivate::_q_emitItemChanged
          (QStandardItemModelPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QStandardItemModel *pQVar4;
  QStandardItem *pQVar5;
  QModelIndex *in_RDX;
  QStandardItemModelPrivate *in_RSI;
  QStandardItemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QStandardItem *item;
  int column;
  int row;
  QStandardItemModel *q;
  QModelIndex index;
  QModelIndex parent;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar7;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  iVar1 = QModelIndex::row((QModelIndex *)in_RSI);
  while( true ) {
    iVar7 = iVar1;
    iVar2 = QModelIndex::row(in_RDX);
    if (iVar2 < iVar1) break;
    iVar2 = QModelIndex::column((QModelIndex *)in_RSI);
    while( true ) {
      iVar6 = iVar2;
      iVar3 = QModelIndex::column(in_RDX);
      if (iVar3 < iVar2) break;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)pQVar4 + 0x60))(&local_38,pQVar4,iVar7,iVar6,&local_20);
      pQVar5 = itemFromIndex(in_RSI,in_RDX);
      if (pQVar5 != (QStandardItem *)0x0) {
        QStandardItemModel::itemChanged
                  ((QStandardItemModel *)0x8ced9e,(QStandardItem *)CONCAT44(iVar1,iVar2));
      }
      iVar2 = iVar6 + 1;
    }
    iVar1 = iVar7 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemModelPrivate::_q_emitItemChanged(const QModelIndex &topLeft,
                                                   const QModelIndex &bottomRight)
{
    Q_Q(QStandardItemModel);
    QModelIndex parent = topLeft.parent();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        for (int column = topLeft.column(); column <= bottomRight.column(); ++column) {
            QModelIndex index = q->index(row, column, parent);
            if (QStandardItem *item = itemFromIndex(index))
                emit q->itemChanged(item);
        }
    }
}